

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wpd_node.cc
# Opt level: O1

int __thiscall webrtc::WPDNode::Update(WPDNode *this,float *parent_data,size_t parent_data_length)

{
  FIRFilter *pFVar1;
  _Head_base<0UL,_float_*,_false> _Var2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  size_t half_length;
  ulong uVar6;
  
  iVar5 = -1;
  if ((parent_data != (float *)0x0) && (uVar6 = parent_data_length >> 1, uVar6 == this->length_)) {
    pFVar1 = (this->filter_)._M_t.
             super___uniq_ptr_impl<webrtc::FIRFilter,_std::default_delete<webrtc::FIRFilter>_>._M_t.
             super__Tuple_impl<0UL,_webrtc::FIRFilter_*,_std::default_delete<webrtc::FIRFilter>_>.
             super__Head_base<0UL,_webrtc::FIRFilter_*,_false>._M_head_impl;
    (*pFVar1->_vptr_FIRFilter[2])
              (pFVar1,parent_data,parent_data_length,
               (this->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl);
    _Var2._M_head_impl =
         (this->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl;
    uVar3 = this->length_;
    uVar4 = 0;
    if ((1 < parent_data_length) &&
       (((uVar6 <= uVar3 && (parent_data_length != 0)) &&
        (uVar4 = 0, _Var2._M_head_impl != (float *)0x0)))) {
      uVar4 = 0;
      do {
        _Var2._M_head_impl[uVar4] = _Var2._M_head_impl[uVar4 * 2 + 1];
        uVar4 = uVar4 + 1;
      } while (uVar6 != uVar4);
    }
    if (uVar4 == uVar3) {
      iVar5 = 0;
      if (uVar3 != 0) {
        uVar6 = 0;
        do {
          _Var2._M_head_impl[uVar6] = ABS(_Var2._M_head_impl[uVar6]);
          uVar6 = uVar6 + 1;
          iVar5 = 0;
        } while (uVar3 != uVar6);
      }
    }
  }
  return iVar5;
}

Assistant:

int WPDNode::Update(const float* parent_data, size_t parent_data_length) {
  if (!parent_data || (parent_data_length / 2) != length_) {
    return -1;
  }

  // Filter data.
  filter_->Filter(parent_data, parent_data_length, data_.get());

  // Decimate data.
  const bool kOddSequence = true;
  size_t output_samples = DyadicDecimate(
      data_.get(), parent_data_length, kOddSequence, data_.get(), length_);
  if (output_samples != length_) {
    return -1;
  }

  // Get abs to all values.
  for (size_t i = 0; i < length_; ++i) {
    data_[i] = fabs(data_[i]);
  }

  return 0;
}